

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O0

MetadataResult SetNullValue(ShellState *state,char **azArg,idx_t nArg)

{
  long in_RSI;
  long in_RDI;
  
  std::__cxx11::string::operator=((string *)(in_RDI + 0xf8),*(char **)(in_RSI + 8));
  return SUCCESS;
}

Assistant:

MetadataResult SetNullValue(ShellState &state, const char **azArg, idx_t nArg) {
	state.nullValue = azArg[1];
	return MetadataResult::SUCCESS;
}